

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_fd512ddf comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b;
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  bool bVar7;
  ulong uVar8;
  pdqsort_detail *ppVar9;
  long lVar10;
  long lVar11;
  T tmp;
  pdqsort_detail *ppVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  long lVar17;
  undefined4 in_register_0000008c;
  long lVar19;
  int *piVar20;
  HighsInt *pHVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  pdqsort_detail *ppVar25;
  int *piVar26;
  ulong uVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  anon_class_16_2_fd512ddf comp_00;
  anon_class_16_2_fd512ddf comp_01;
  anon_class_16_2_fd512ddf comp_02;
  anon_class_16_2_fd512ddf comp_03;
  anon_class_16_2_fd512ddf comp_04;
  anon_class_16_2_fd512ddf comp_05;
  anon_class_16_2_fd512ddf comp_06;
  anon_class_16_2_fd512ddf comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:61:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:61:13)>
  __comp_00;
  _DistanceType __len;
  undefined1 in_stack_ffffffffffffff58;
  pdqsort_detail *local_a0;
  int local_64;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var18;
  
  pHVar21 = (HighsInt *)CONCAT44(in_register_0000008c,bad_allowed);
  comp_00.this = comp.this;
  local_64 = (int)comp.r;
  lVar11 = (long)begin._M_current - (long)this;
  uVar8 = lVar11 >> 2;
  if (0x17 < (long)uVar8) {
    b._M_current = begin._M_current + -1;
LAB_002812ce:
    uVar27 = uVar8 >> 1;
    _Var16._M_current = (int *)((long)this + uVar27 * 4);
    if (uVar8 < 0x81) {
      comp_07.r = pHVar21;
      comp_07.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)_Var16._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,b,end,
                 comp_07);
    }
    else {
      comp_03.r = pHVar21;
      comp_03.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                (this,_Var16,b,end,comp_03);
      comp_04.r = pHVar21;
      comp_04.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + 4),(int *)((long)this + (uVar27 - 1) * 4),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -2),end,comp_04);
      _Var18._M_current = (int *)((long)this + (uVar27 + 1) * 4);
      comp_05.r = pHVar21;
      comp_05.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + 8),_Var18,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -3),end,comp_05);
      comp_06.r = pHVar21;
      comp_06.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + (uVar27 - 1) * 4),_Var16,_Var18,end,comp_06);
      iVar5 = *(int *)this;
      *(int *)this = _Var18._M_current[-1];
      _Var18._M_current[-1] = iVar5;
    }
    iVar5 = *(int *)this;
    lVar23 = (long)iVar5;
    lVar17 = *(long *)(end._M_current + 0x14);
    if ((bad_allowed & 1U) == 0) {
      lVar24 = (long)*(int *)((long)this + -4);
      dVar2 = *(double *)(lVar17 + lVar24 * 8);
      if ((1.5 <= dVar2) || (*(double *)(lVar17 + lVar23 * 8) <= 1.5)) {
        if ((1.5 < dVar2) &&
           (pdVar1 = (double *)(lVar17 + lVar23 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)) {
LAB_00281c30:
          dVar2 = *(double *)(lVar17 + lVar23 * 8);
          lVar11 = 0;
          do {
            iVar15 = *(b._M_current + lVar11);
            lVar24 = (long)iVar15;
            if ((1.5 <= dVar2) || (*(double *)(lVar17 + lVar24 * 8) <= 1.5)) {
              if ((1.5 < dVar2) &&
                 (pdVar1 = (double *)(lVar17 + lVar24 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
              goto LAB_00281d5d;
              pHVar21 = *(HighsInt **)(end._M_current + 0x1a);
              dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
              dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar24 * 8);
              dVar29 = *(double *)(end._M_current + 0x2c);
              if (*(double *)(pHVar21 + lVar23 * 2) * dVar3 <=
                  *(double *)(pHVar21 + lVar24 * 2) * dVar4 + dVar29) {
                if (*(double *)(pHVar21 + lVar23 * 2) * dVar3 <
                    *(double *)(pHVar21 + lVar24 * 2) * dVar4 - dVar29) goto LAB_00281d5d;
                if (ABS(dVar3 - dVar4) <= dVar29) {
                  uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
                  lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
                  lVar13 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
                  pHVar21 = (HighsInt *)
                            ((uVar8 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                            (uVar8 + 0x42d8680e260ae5b) * lVar10);
                  uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar24 * 4);
                  if (pHVar21 <=
                      (HighsInt *)
                      ((uVar8 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                      (uVar8 + 0x42d8680e260ae5b) * lVar10)) goto LAB_00281d5d;
                }
                else if (dVar3 <= dVar4) goto LAB_00281d5d;
              }
            }
            lVar11 = lVar11 + -4;
          } while( true );
        }
        dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar24 * 8);
        dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar24 * 8) * dVar2;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
        dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
        dVar4 = *(double *)(end._M_current + 0x2c);
        if (dVar29 <= dVar30 + dVar4) {
          if (dVar29 < dVar30 - dVar4) goto LAB_00281c30;
          if (ABS(dVar2 - dVar3) <= dVar4) {
            uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar24 * 4);
            lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
            lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
            uVar28 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
            pHVar21 = (HighsInt *)((uVar28 + 0x42d8680e260ae5b) * lVar24);
            if (((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
                (uVar27 + 0x42d8680e260ae5b) * lVar24) <=
                ((uVar28 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^ (ulong)pHVar21))
            goto LAB_00281c30;
          }
          else if (dVar2 <= dVar3) goto LAB_00281c30;
        }
      }
    }
    lVar24 = 0;
    _Var16._M_current = (int *)this;
    do {
      piVar14 = _Var16._M_current + 1;
      iVar15 = *piVar14;
      lVar10 = (long)iVar15;
      dVar2 = *(double *)(lVar17 + lVar10 * 8);
      if ((1.5 <= dVar2) || (*(double *)(lVar17 + lVar23 * 8) <= 1.5)) {
        if ((1.5 < dVar2) &&
           (pdVar1 = (double *)(lVar17 + lVar23 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
        goto LAB_0028155d;
        dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar10 * 8);
        dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar10 * 8) * dVar2;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
        dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
        dVar4 = *(double *)(end._M_current + 0x2c);
        if (dVar29 <= dVar30 + dVar4) {
          if (dVar29 < dVar30 - dVar4) goto LAB_0028155d;
          if (ABS(dVar2 - dVar3) <= dVar4) {
            uVar28 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar10 * 4);
            lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
            lVar13 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
            uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
            if (((uVar28 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                (uVar28 + 0x42d8680e260ae5b) * lVar10) <=
                ((uVar27 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                (uVar27 + 0x42d8680e260ae5b) * lVar10)) goto LAB_0028155d;
          }
          else if (dVar2 <= dVar3) goto LAB_0028155d;
        }
      }
      lVar24 = lVar24 + -4;
      _Var16._M_current = piVar14;
    } while( true );
  }
  local_a0 = this;
  if ((char)bad_allowed == '\0') goto LAB_00282388;
LAB_00280f96:
  if ((local_a0 != (pdqsort_detail *)begin._M_current) &&
     (local_a0 + 4 != (pdqsort_detail *)begin._M_current)) {
    lVar11 = *(long *)(end._M_current + 0x14);
    lVar17 = 0;
    ppVar25 = local_a0 + 4;
    ppVar12 = local_a0;
    do {
      ppVar9 = ppVar25;
      iVar5 = *(int *)(ppVar12 + 4);
      lVar23 = (long)iVar5;
      dVar2 = *(double *)(lVar11 + lVar23 * 8);
      lVar24 = (long)*(int *)ppVar12;
      if ((1.5 <= dVar2) || (*(double *)(lVar11 + lVar24 * 8) <= 1.5)) {
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar11 + lVar24 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
          dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar24 * 8);
          dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar24 * 8) * dVar4;
          dVar29 = *(double *)(end._M_current + 0x2c);
          if (dVar31 + dVar29 < dVar30) goto LAB_0028105b;
          if (dVar31 - dVar29 <= dVar30) {
            if (ABS(dVar3 - dVar4) <= dVar29) {
              uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
              lVar13 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
              lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
              uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar24 * 4);
              if (((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
                  (uVar27 + 0x42d8680e260ae5b) * lVar13) <
                  ((uVar8 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
                  (uVar8 + 0x42d8680e260ae5b) * lVar13)) goto LAB_0028105b;
            }
            else if (dVar4 < dVar3) goto LAB_0028105b;
          }
        }
      }
      else {
LAB_0028105b:
        ppVar25 = ppVar9 + -4;
        *(int *)(ppVar12 + 4) = *(int *)ppVar12;
        ppVar12 = local_a0;
        lVar24 = lVar17;
        if (ppVar25 != local_a0) {
          do {
            lVar10 = (long)*(int *)(local_a0 + lVar24 + -4);
            if ((1.5 <= dVar2) || (*(double *)(lVar11 + lVar10 * 8) <= 1.5)) {
              ppVar12 = ppVar25;
              if ((1.5 < dVar2) &&
                 (pdVar1 = (double *)(lVar11 + lVar10 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
              break;
              dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
              dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
              dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar10 * 8);
              dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar10 * 8) * dVar4;
              dVar29 = *(double *)(end._M_current + 0x2c);
              if (dVar30 <= dVar31 + dVar29) {
                if (dVar30 < dVar31 - dVar29) {
                  ppVar12 = local_a0 + lVar24;
                  break;
                }
                if (ABS(dVar3 - dVar4) <= dVar29) {
                  uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
                  lVar19 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
                  lVar13 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
                  uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar10 * 4);
                  if (((uVar27 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                      (uVar27 + 0x42d8680e260ae5b) * lVar19) <=
                      ((uVar8 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                      (uVar8 + 0x42d8680e260ae5b) * lVar19)) break;
                }
                else if (dVar3 <= dVar4) break;
              }
            }
            ppVar25 = ppVar25 + -4;
            *(int *)(local_a0 + lVar24) = *(int *)(local_a0 + lVar24 + -4);
            lVar24 = lVar24 + -4;
            ppVar12 = local_a0;
          } while (lVar24 != 0);
        }
        *(int *)ppVar12 = iVar5;
      }
      lVar17 = lVar17 + 4;
      ppVar25 = ppVar9 + 4;
      ppVar12 = ppVar9;
    } while (ppVar9 + 4 != (pdqsort_detail *)begin._M_current);
  }
  return;
LAB_00281d5d:
  piVar14 = b._M_current + lVar11;
  _Var16._M_current = (int *)this;
  iVar22 = iVar5;
  if (lVar11 == 0) {
joined_r0x00281ef1:
    if (_Var16._M_current < piVar14) {
      while( true ) {
        _Var16._M_current = _Var16._M_current + 1;
        iVar22 = *_Var16._M_current;
        pHVar21 = (HighsInt *)(long)iVar22;
        if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar17 + (long)pHVar21 * 8))) goto LAB_00282289;
        if ((1.5 < dVar2) &&
           (pdVar1 = (double *)(lVar17 + (long)pHVar21 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
        break;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
        dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
        dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + (long)pHVar21 * 8);
        dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + (long)pHVar21 * 8) * dVar4;
        dVar29 = *(double *)(end._M_current + 0x2c);
        if (dVar31 + dVar29 < dVar30) goto LAB_00282289;
        if (dVar30 < dVar31 - dVar29) break;
        if (ABS(dVar3 - dVar4) <= dVar29) {
          if ((piVar14 <= _Var16._M_current) ||
             (uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4),
             lVar11 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536,
             lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3,
             uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + (long)pHVar21 * 4),
             pHVar21 = (HighsInt *)((uVar8 + 0x42d8680e260ae5b) * lVar11),
             ((uVar8 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^ (ulong)pHVar21) <
             ((uVar27 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^ (uVar27 + 0x42d8680e260ae5b) * lVar11
             ))) goto LAB_00282289;
        }
        else if ((piVar14 <= _Var16._M_current) || (dVar4 < dVar3)) goto LAB_00282289;
      }
      goto joined_r0x00281ef1;
    }
  }
  else {
    do {
      while( true ) {
        do {
          do {
            _Var16._M_current = _Var16._M_current + 1;
            iVar22 = *_Var16._M_current;
            pHVar21 = (HighsInt *)(long)iVar22;
            if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar17 + (long)pHVar21 * 8))) goto LAB_00282289;
          } while ((1.5 < dVar2) &&
                  (pdVar1 = (double *)(lVar17 + (long)pHVar21 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5
                  ));
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
          dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + (long)pHVar21 * 8);
          dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + (long)pHVar21 * 8) * dVar4;
          dVar29 = *(double *)(end._M_current + 0x2c);
          if (dVar31 + dVar29 < dVar30) goto LAB_00282289;
        } while (dVar30 < dVar31 - dVar29);
        if (ABS(dVar3 - dVar4) <= dVar29) break;
        if (dVar4 < dVar3) goto LAB_00282289;
      }
      uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
      lVar11 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
      lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
      uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + (long)pHVar21 * 4);
      pHVar21 = (HighsInt *)
                ((uVar8 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^
                (uVar8 + 0x42d8680e260ae5b) * lVar11);
    } while ((HighsInt *)
             ((uVar27 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^ (uVar27 + 0x42d8680e260ae5b) * lVar11
             ) <= pHVar21);
  }
LAB_00282289:
  if (_Var16._M_current < piVar14) {
    *_Var16._M_current = iVar15;
    *piVar14 = iVar22;
LAB_00282050:
    do {
      do {
        piVar14 = piVar14 + -1;
        iVar15 = *piVar14;
        lVar11 = (long)iVar15;
        if (dVar2 < 1.5) {
          if (1.5 < *(double *)(lVar17 + lVar11 * 8)) goto LAB_00282050;
        }
        if ((1.5 < dVar2) &&
           (pdVar1 = (double *)(lVar17 + lVar11 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
        goto LAB_002821f3;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
        dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
        dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar11 * 8);
        dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar11 * 8) * dVar4;
        dVar29 = *(double *)(end._M_current + 0x2c);
      } while (dVar31 + dVar29 < dVar30);
      if (dVar30 < dVar31 - dVar29) break;
      if (dVar29 < ABS(dVar3 - dVar4)) {
        if (dVar3 <= dVar4) break;
        goto LAB_00282050;
      }
      uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
      lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
      lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
      uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar11 * 4);
    } while (((uVar8 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^ (uVar8 + 0x42d8680e260ae5b) * lVar24)
             < ((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
               (uVar27 + 0x42d8680e260ae5b) * lVar24));
LAB_002821f3:
    do {
      do {
        do {
          _Var16._M_current = _Var16._M_current + 1;
          iVar22 = *_Var16._M_current;
          pHVar21 = (HighsInt *)(long)iVar22;
          if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar17 + (long)pHVar21 * 8))) goto LAB_00282289;
        } while ((1.5 < dVar2) &&
                (pdVar1 = (double *)(lVar17 + (long)pHVar21 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
        ;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
        dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
        dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + (long)pHVar21 * 8);
        dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + (long)pHVar21 * 8) * dVar4;
        dVar29 = *(double *)(end._M_current + 0x2c);
        if (dVar31 + dVar29 < dVar30) goto LAB_00282289;
      } while (dVar30 < dVar31 - dVar29);
      if (dVar29 < ABS(dVar3 - dVar4)) {
        if (dVar4 < dVar3) break;
        goto LAB_002821f3;
      }
      uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
      lVar11 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
      lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
      uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + (long)pHVar21 * 4);
      pHVar21 = (HighsInt *)((uVar8 + 0x42d8680e260ae5b) * lVar11);
    } while (((uVar27 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^ (uVar27 + 0x42d8680e260ae5b) * lVar11
             ) <= ((uVar8 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^ (ulong)pHVar21));
    goto LAB_00282289;
  }
  *(int *)this = iVar15;
  *piVar14 = iVar5;
  this = (pdqsort_detail *)(piVar14 + 1);
  lVar11 = (long)begin._M_current - (long)this;
  uVar8 = lVar11 >> 2;
  goto LAB_002822b3;
LAB_0028155d:
  _Var18._M_current = b._M_current;
  if (lVar24 == 0) {
    _Var18._M_current = begin._M_current;
    _Var6._M_current = b._M_current;
    if (piVar14 < begin._M_current) {
      while( true ) {
        _Var18._M_current = _Var6._M_current;
        lVar24 = (long)*_Var18._M_current;
        dVar2 = *(double *)(lVar17 + lVar24 * 8);
        if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar17 + lVar23 * 8))) break;
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar17 + lVar23 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar24 * 8);
          dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar24 * 8) * dVar2;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
          dVar4 = *(double *)(end._M_current + 0x2c);
          if (dVar30 + dVar4 < dVar29) break;
          if (dVar29 < dVar30 - dVar4) goto LAB_0028172d;
          if (ABS(dVar2 - dVar3) <= dVar4) {
            if ((_Var18._M_current <= piVar14) ||
               (uVar28 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar24 * 4),
               lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536,
               lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3,
               uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4),
               ((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
               (uVar27 + 0x42d8680e260ae5b) * lVar24) <
               ((uVar28 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
               (uVar28 + 0x42d8680e260ae5b) * lVar24))) break;
          }
          else if ((_Var18._M_current <= piVar14) || (dVar3 < dVar2)) break;
        }
        else {
LAB_0028172d:
          if (_Var18._M_current <= piVar14) break;
        }
        _Var6._M_current = _Var18._M_current + -1;
      }
    }
  }
  else {
    while( true ) {
      lVar24 = (long)*_Var18._M_current;
      dVar2 = *(double *)(lVar17 + lVar24 * 8);
      if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar17 + lVar23 * 8))) break;
      if ((dVar2 <= 1.5) ||
         (pdVar1 = (double *)(lVar17 + lVar23 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
        dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar24 * 8);
        dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar24 * 8) * dVar2;
        dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
        dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
        dVar4 = *(double *)(end._M_current + 0x2c);
        if (dVar30 + dVar4 < dVar29) break;
        if (dVar30 - dVar4 <= dVar29) {
          if (ABS(dVar2 - dVar3) <= dVar4) {
            uVar28 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar24 * 4);
            lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
            lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
            uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
            if (((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
                (uVar27 + 0x42d8680e260ae5b) * lVar24) <
                ((uVar28 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
                (uVar28 + 0x42d8680e260ae5b) * lVar24)) break;
          }
          else if (dVar3 < dVar2) break;
        }
      }
      _Var18._M_current = _Var18._M_current + -1;
    }
  }
  if (piVar14 < _Var18._M_current) {
    iVar22 = *_Var18._M_current;
    piVar20 = _Var18._M_current;
    piVar26 = piVar14;
    do {
      *piVar26 = iVar22;
      *piVar20 = iVar15;
LAB_0028180f:
      do {
        do {
          _Var16._M_current = piVar26;
          piVar26 = _Var16._M_current + 1;
          iVar15 = *piVar26;
          lVar24 = (long)iVar15;
          dVar2 = *(double *)(lVar17 + lVar24 * 8);
          if (dVar2 < 1.5) {
            if (1.5 < *(double *)(lVar17 + lVar23 * 8)) goto LAB_0028180f;
          }
          if ((1.5 < dVar2) &&
             (pdVar1 = (double *)(lVar17 + lVar23 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
          goto LAB_002819a3;
          dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar24 * 8);
          dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar24 * 8) * dVar2;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
          dVar4 = *(double *)(end._M_current + 0x2c);
        } while (dVar30 + dVar4 < dVar29);
        if (dVar29 < dVar30 - dVar4) break;
        if (dVar4 < ABS(dVar2 - dVar3)) {
          if (dVar2 <= dVar3) break;
          goto LAB_0028180f;
        }
        uVar28 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar24 * 4);
        lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
        lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
      } while (((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
               (uVar27 + 0x42d8680e260ae5b) * lVar24) <
               ((uVar28 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
               (uVar28 + 0x42d8680e260ae5b) * lVar24));
LAB_002819a3:
      do {
        do {
          do {
            piVar20 = piVar20 + -1;
            iVar22 = *piVar20;
            lVar24 = (long)iVar22;
            dVar2 = *(double *)(lVar17 + lVar24 * 8);
            if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar17 + lVar23 * 8))) goto LAB_00281a3c;
          } while ((1.5 < dVar2) &&
                  (pdVar1 = (double *)(lVar17 + lVar23 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5));
          dVar2 = *(double *)(*(long *)(end._M_current + 0x30) + lVar24 * 8);
          dVar29 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar24 * 8) * dVar2;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar3;
          dVar4 = *(double *)(end._M_current + 0x2c);
          if (dVar30 + dVar4 < dVar29) goto LAB_00281a3c;
        } while (dVar29 < dVar30 - dVar4);
        if (dVar4 < ABS(dVar2 - dVar3)) {
          if (dVar3 < dVar2) break;
          goto LAB_002819a3;
        }
        uVar28 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar24 * 4);
        lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
        lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
      } while (((uVar28 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
               (uVar28 + 0x42d8680e260ae5b) * lVar24) <=
               ((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
               (uVar27 + 0x42d8680e260ae5b) * lVar24));
LAB_00281a3c:
    } while (piVar26 < piVar20);
  }
  *(int *)this = *_Var16._M_current;
  *_Var16._M_current = iVar5;
  uVar27 = (long)_Var16._M_current - (long)this >> 2;
  ppVar25 = (pdqsort_detail *)(_Var16._M_current + 1);
  uVar28 = (long)begin._M_current - (long)ppVar25 >> 2;
  if (((long)uVar27 < (long)(uVar8 >> 3)) || ((long)uVar28 < (long)(uVar8 >> 3))) {
    local_64 = local_64 + -1;
    if (local_64 == 0) {
      uVar27 = uVar8 - 2 >> 1;
      do {
        __comp._M_comp.r = (HighsInt *)comp_00.this;
        __comp._M_comp.this = (HighsCutGeneration *)end._M_current;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__1>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,uVar27,
                   uVar8,*(int *)((long)this + uVar27 * 4),__comp);
        bVar7 = uVar27 != 0;
        uVar27 = uVar27 - 1;
      } while (bVar7);
      if (lVar11 < 5) {
        return;
      }
      lVar11 = (long)begin._M_current - (long)this;
      do {
        begin._M_current = begin._M_current + -1;
        iVar5 = *begin._M_current;
        *begin._M_current = *(int *)this;
        lVar11 = lVar11 + -4;
        __comp_00._M_comp.r = (HighsInt *)comp_00.this;
        __comp_00._M_comp.this = (HighsCutGeneration *)end._M_current;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__1>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,0,
                   lVar11 >> 2,iVar5,__comp_00);
      } while (4 < lVar11);
      return;
    }
    if (0x17 < (long)uVar27) {
      uVar8 = uVar27 & 0xfffffffffffffffc;
      iVar5 = *(int *)this;
      *(int *)this = *(int *)((long)this + uVar8);
      *(int *)((long)this + uVar8) = iVar5;
      iVar5 = _Var16._M_current[-1];
      _Var16._M_current[-1] = *(_Var16._M_current - uVar8);
      *(_Var16._M_current - uVar8) = iVar5;
      if (0x80 < uVar27) {
        uVar27 = uVar27 >> 2;
        iVar5 = *(int *)((long)this + 4);
        *(int *)((long)this + 4) = *(int *)((long)this + (uVar27 + 1) * 4);
        *(int *)((long)this + (uVar27 + 1) * 4) = iVar5;
        iVar5 = *(int *)((long)this + 8);
        *(int *)((long)this + 8) = *(int *)((long)this + (uVar27 + 2) * 4);
        *(int *)((long)this + (uVar27 + 2) * 4) = iVar5;
        iVar5 = _Var16._M_current[-2];
        _Var16._M_current[-2] = _Var16._M_current[~uVar27];
        _Var16._M_current[~uVar27] = iVar5;
        iVar5 = _Var16._M_current[-3];
        _Var16._M_current[-3] = _Var16._M_current[-2 - uVar27];
        _Var16._M_current[-2 - uVar27] = iVar5;
      }
    }
    if (0x17 < (long)uVar28) {
      iVar5 = _Var16._M_current[1];
      uVar8 = uVar28 & 0xfffffffffffffffc;
      _Var16._M_current[1] = *(uVar8 + 4 + _Var16._M_current);
      *(uVar8 + 4 + _Var16._M_current) = iVar5;
      iVar5 = begin._M_current[-1];
      begin._M_current[-1] = *(begin._M_current - uVar8);
      *(begin._M_current - uVar8) = iVar5;
      if (0x80 < uVar28) {
        uVar8 = uVar28 >> 2;
        iVar5 = _Var16._M_current[2];
        _Var16._M_current[2] = _Var16._M_current[uVar8 + 2];
        _Var16._M_current[uVar8 + 2] = iVar5;
        iVar5 = _Var16._M_current[3];
        _Var16._M_current[3] = _Var16._M_current[uVar8 + 3];
        _Var16._M_current[uVar8 + 3] = iVar5;
        iVar5 = begin._M_current[-2];
        begin._M_current[-2] = begin._M_current[~uVar8];
        begin._M_current[~uVar8] = iVar5;
        iVar5 = begin._M_current[-3];
        begin._M_current[-3] = begin._M_current[-2 - uVar8];
        begin._M_current[-2 - uVar8] = iVar5;
      }
    }
  }
  else if (((_Var18._M_current <= piVar14) &&
           (comp_00.r = _Var18._M_current,
           bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                             (this,_Var16,end,comp_00), bVar7)) &&
          (comp_01.r = _Var18._M_current, comp_01.this = comp_00.this,
          bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                            (ppVar25,begin,end,comp_01), bVar7)) {
    return;
  }
  pHVar21 = (HighsInt *)(ulong)(bad_allowed & 1U);
  comp_02.r._0_4_ = local_64;
  comp_02.this = comp_00.this;
  comp_02.r._4_4_ = 0;
  pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
            (this,_Var16,end,comp_02,bad_allowed & 1U,(bool)in_stack_ffffffffffffff58);
  bad_allowed = 0;
  lVar11 = (long)begin._M_current - (long)ppVar25;
  this = ppVar25;
  uVar8 = uVar28;
LAB_002822b3:
  if ((long)uVar8 < 0x18) goto LAB_00282373;
  goto LAB_002812ce;
LAB_00282373:
  local_a0 = this;
  if ((bad_allowed & 1U) == 0) {
LAB_00282388:
    if (local_a0 == (pdqsort_detail *)begin._M_current) {
      return;
    }
    if (local_a0 + 4 == (pdqsort_detail *)begin._M_current) {
      return;
    }
    lVar11 = *(long *)(end._M_current + 0x14);
    ppVar25 = local_a0 + 4;
LAB_002823d9:
    ppVar12 = ppVar25;
    iVar15 = *(int *)local_a0;
    iVar5 = *(int *)(local_a0 + 4);
    lVar17 = (long)iVar5;
    dVar2 = *(double *)(lVar11 + lVar17 * 8);
    lVar23 = (long)iVar15;
    ppVar25 = ppVar12;
    if ((dVar2 < 1.5) && (1.5 < *(double *)(lVar11 + lVar23 * 8))) {
LAB_00282471:
      do {
        *(int *)ppVar25 = iVar15;
        iVar15 = *(int *)(ppVar25 + -8);
        lVar23 = (long)iVar15;
        if ((1.5 <= dVar2) || (*(double *)(lVar11 + lVar23 * 8) <= 1.5)) {
          if ((1.5 < dVar2) &&
             (pdVar1 = (double *)(lVar11 + lVar23 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5))
          goto LAB_0028256c;
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar17 * 8);
          dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar17 * 8) * dVar3;
          dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
          dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar4;
          dVar29 = *(double *)(end._M_current + 0x2c);
          if (dVar30 <= dVar31 + dVar29) {
            if (dVar30 < dVar31 - dVar29) goto LAB_0028256c;
            if (ABS(dVar3 - dVar4) <= dVar29) {
              uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar17 * 4);
              lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
              lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
              uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
              if (((uVar27 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^
                  (uVar27 + 0x42d8680e260ae5b) * lVar10) <=
                  ((uVar8 + 0xc8497d2a400d9551) * lVar24 >> 0x20 ^
                  (uVar8 + 0x42d8680e260ae5b) * lVar10)) goto LAB_0028256c;
            }
            else if (dVar3 <= dVar4) goto LAB_0028256c;
          }
        }
        ppVar25 = ppVar25 + -4;
      } while( true );
    }
    if ((dVar2 <= 1.5) ||
       (pdVar1 = (double *)(lVar11 + lVar23 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
      dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar17 * 8);
      dVar30 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar17 * 8) * dVar3;
      dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar23 * 8);
      dVar31 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar23 * 8) * dVar4;
      dVar29 = *(double *)(end._M_current + 0x2c);
      if (dVar31 + dVar29 < dVar30) goto LAB_00282471;
      if (dVar31 - dVar29 <= dVar30) {
        if (ABS(dVar3 - dVar4) <= dVar29) {
          uVar27 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar17 * 4);
          lVar24 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x8a183895eeac1536;
          lVar10 = (ulong)*(uint *)&(comp_00.this)->lpRelaxation + 0x80c8963be3e4c2f3;
          uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar23 * 4);
          if (((uVar8 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^ (uVar8 + 0x42d8680e260ae5b) * lVar24)
              < ((uVar27 + 0xc8497d2a400d9551) * lVar10 >> 0x20 ^
                (uVar27 + 0x42d8680e260ae5b) * lVar24)) goto LAB_00282471;
        }
        else if (dVar4 < dVar3) goto LAB_00282471;
      }
    }
    goto LAB_00282570;
  }
  goto LAB_00280f96;
LAB_0028256c:
  *(int *)(ppVar25 + -4) = iVar5;
LAB_00282570:
  ppVar25 = ppVar12 + 4;
  local_a0 = ppVar12;
  if (ppVar12 + 4 == (pdqsort_detail *)begin._M_current) {
    return;
  }
  goto LAB_002823d9;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }